

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

uint32_t random32(void)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  
  if (random32()::dev == '\0') {
    iVar2 = __cxa_guard_acquire(&random32()::dev);
    if (iVar2 != 0) {
      std::random_device::random_device(&random32::dev);
      __cxa_atexit(std::random_device::~random_device,&random32::dev,&__dso_handle);
      __cxa_guard_release(&random32()::dev);
    }
  }
  if (random32()::raand == '\0') {
    iVar2 = __cxa_guard_acquire(&random32()::raand);
    if (iVar2 != 0) {
      uVar3 = std::random_device::_M_getval();
      iVar2 = (int)((uVar3 & 0xffffffff) % 0x7fffffff);
      random32::raand._M_x = (unsigned_long)(iVar2 + (uint)(iVar2 == 0));
      __cxa_guard_release(&random32()::raand);
    }
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = random32::raand._M_x * 0xbc8f;
  random32::raand._M_x = SUB168(auVar1 % ZEXT816(0x7fffffff),0);
  return SUB164(auVar1 % ZEXT816(0x7fffffff),0);
}

Assistant:

uint32_t random32()
{
    static std::random_device dev;
    static std::minstd_rand raand(dev());
    return raand();
}